

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnGlobalGetExpr
          (BinaryReaderInterp *this,Index global_index)

{
  pointer pGVar1;
  ulong uVar2;
  Result RVar3;
  Enum EVar4;
  uint uVar5;
  ulong uVar6;
  Enum op;
  char *pcVar7;
  Location loc_1;
  Location loc;
  Location LStack_170;
  Location LStack_150;
  Var VStack_130;
  ulong uStack_e8;
  Location *pLStack_e0;
  Var *pVStack_d8;
  BinaryReaderInterp *pBStack_d0;
  SharedValidator *pSStack_c8;
  code *pcStack_c0;
  Location local_b8;
  Location local_98;
  Var local_78;
  
  uVar2 = (ulong)global_index;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  local_b8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_b8.field_1.field_0.last_column = 0;
  local_b8.filename._M_len = (this->filename_)._M_len;
  local_b8.filename._M_str = (this->filename_)._M_str;
  pcStack_c0 = (code *)0x11e2fc;
  local_98.field_1.field_1.offset = local_b8.field_1.field_1.offset;
  Var::Var(&local_78,global_index,&local_b8);
  pcStack_c0 = (code *)0x11e30a;
  RVar3 = SharedValidator::OnGlobalGet(&this->validator_,&local_98,&local_78);
  pcStack_c0 = (code *)0x11e314;
  Var::~Var(&local_78);
  EVar4 = Error;
  if (RVar3.enum_ != Error) {
    pGVar1 = (this->global_types_).
             super__Vector_base<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->global_types_).
                   super__Vector_base<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar1 >> 3) *
            -0x5555555555555555;
    if (uVar6 < uVar2 || uVar6 - uVar2 == 0) {
      pcVar7 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
      pcStack_c0 = OnGlobalSetExpr;
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      LStack_150.field_1.field_0.last_column = 0;
      LStack_150.filename._M_len = *(size_t *)(pcVar7 + 0x3a0);
      LStack_150.filename._M_str = *(char **)(pcVar7 + 0x3a8);
      LStack_170.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           *(size_t *)(*(long *)(pcVar7 + 8) + 0x10);
      LStack_170.field_1.field_0.last_column = 0;
      LStack_170.filename._M_len = *(size_t *)(pcVar7 + 0x3a0);
      LStack_170.filename._M_str = *(char **)(pcVar7 + 0x3a8);
      LStack_150.field_1.field_1.offset = LStack_170.field_1.field_1.offset;
      uStack_e8 = uVar2;
      pLStack_e0 = &local_98;
      pVStack_d8 = &local_78;
      pBStack_d0 = this;
      pSStack_c8 = &this->validator_;
      pcStack_c0 = (code *)(ulong)RVar3.enum_;
      Var::Var(&VStack_130,global_index,&LStack_170);
      RVar3 = SharedValidator::OnGlobalSet
                        ((SharedValidator *)(pcVar7 + 0x28),&LStack_150,&VStack_130);
      Var::~Var(&VStack_130);
      if (RVar3.enum_ != Error) {
        Istream::Emit(*(Istream **)(pcVar7 + 0x20),GlobalSet,global_index);
      }
      return (Result)(uint)(RVar3.enum_ == Error);
    }
    uVar5 = *(int *)&pGVar1[uVar2].super_ExternType.field_0xc + 0x17;
    op = GlobalGet;
    if (uVar5 < 8) {
      op = *(Enum *)(&DAT_0015ab7c + (ulong)uVar5 * 4);
    }
    pcStack_c0 = (code *)0x11e374;
    Istream::Emit(this->istream_,op,global_index);
    EVar4 = Ok;
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderInterp::OnGlobalGetExpr(Index global_index) {
  CHECK_RESULT(
      validator_.OnGlobalGet(GetLocation(), Var(global_index, GetLocation())));

  Type type = global_types_.at(global_index).type;
  if (type.IsRef()) {
    istream_.Emit(Opcode::InterpGlobalGetRef, global_index);
  } else {
    istream_.Emit(Opcode::GlobalGet, global_index);
  }
  return Result::Ok;
}